

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChClassFactory.h
# Opt level: O2

type __thiscall
chrono::ChClassRegistration<chrono::ChConstraintTwoGeneric>::
_archive_in_create<chrono::ChConstraintTwoGeneric>
          (ChClassRegistration<chrono::ChConstraintTwoGeneric> *this,ChArchiveIn *marchive)

{
  undefined8 *puVar1;
  
  puVar1 = (undefined8 *)::operator_new(0x98);
  *(undefined4 *)(puVar1 + 5) = 0;
  puVar1[1] = 0;
  puVar1[2] = 0;
  puVar1[3] = 0;
  puVar1[4] = 0;
  *(undefined1 *)((long)puVar1 + 0x2c) = 1;
  *(undefined4 *)(puVar1 + 6) = 1;
  puVar1[7] = 0;
  *(undefined1 (*) [16])(puVar1 + 9) = ZEXT416(0) << 0x40;
  *puVar1 = &PTR__ChConstraintTwoGeneric_01186d30;
  *(undefined1 (*) [64])(puVar1 + 0xb) = ZEXT464(0) << 0x40;
  return puVar1;
}

Assistant:

typename enable_if< !ChDetect_ArchiveINconstructor<Tc>::value, void* >::type 
    _archive_in_create(ChArchiveIn& marchive) {
        return reinterpret_cast<void*>(new Tc);
    }